

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  int iVar1;
  ImFont *this_00;
  ImFont **__dest;
  ImFontConfig *pIVar2;
  long lVar3;
  void *__dest_00;
  int iVar4;
  long lVar5;
  char *__function;
  int iVar6;
  ImFontConfig *pIVar7;
  ImFont **ppIVar8;
  byte bVar9;
  
  bVar9 = 0;
  if ((font_cfg->FontData == (void *)0x0) || (font_cfg->FontDataSize < 1)) {
    __assert_fail("font_cfg->FontData != __null && font_cfg->FontDataSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x46d,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if (font_cfg->SizePixels <= 0.0) {
    __assert_fail("font_cfg->SizePixels > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x46e,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if (font_cfg->MergeMode == false) {
    this_00 = (ImFont *)ImGui::MemAlloc(0x68);
    ImFont::ImFont(this_00);
    iVar1 = (this->Fonts).Size;
    if (iVar1 == (this->Fonts).Capacity) {
      if (iVar1 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar1 / 2 + iVar1;
      }
      iVar6 = iVar1 + 1;
      if (iVar1 + 1 < iVar4) {
        iVar6 = iVar4;
      }
      __dest = (ImFont **)ImGui::MemAlloc((long)iVar6 << 3);
      ppIVar8 = (this->Fonts).Data;
      if (ppIVar8 == (ImFont **)0x0) {
        ppIVar8 = (ImFont **)0x0;
      }
      else {
        memcpy(__dest,ppIVar8,(long)(this->Fonts).Size << 3);
        ppIVar8 = (this->Fonts).Data;
      }
      ImGui::MemFree(ppIVar8);
      (this->Fonts).Data = __dest;
      (this->Fonts).Capacity = iVar6;
      iVar1 = (this->Fonts).Size;
    }
    else {
      __dest = (this->Fonts).Data;
    }
    (this->Fonts).Size = iVar1 + 1;
    __dest[iVar1] = this_00;
  }
  iVar1 = (this->ConfigData).Size;
  if (iVar1 == (this->ConfigData).Capacity) {
    if (iVar1 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar1 / 2 + iVar1;
    }
    iVar6 = iVar1 + 1;
    if (iVar1 + 1 < iVar4) {
      iVar6 = iVar4;
    }
    pIVar2 = (ImFontConfig *)ImGui::MemAlloc((long)iVar6 * 0x68);
    pIVar7 = (this->ConfigData).Data;
    if (pIVar7 == (ImFontConfig *)0x0) {
      pIVar7 = (ImFontConfig *)0x0;
    }
    else {
      memcpy(pIVar2,pIVar7,(long)(this->ConfigData).Size * 0x68);
      pIVar7 = (this->ConfigData).Data;
    }
    ImGui::MemFree(pIVar7);
    (this->ConfigData).Data = pIVar2;
    (this->ConfigData).Capacity = iVar6;
    iVar1 = (this->ConfigData).Size;
  }
  else {
    pIVar2 = (this->ConfigData).Data;
  }
  (this->ConfigData).Size = iVar1 + 1;
  pIVar7 = font_cfg;
  pIVar2 = pIVar2 + iVar1;
  for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
    pIVar2->FontData = pIVar7->FontData;
    pIVar7 = (ImFontConfig *)((long)pIVar7 + (ulong)bVar9 * -0x10 + 8);
    pIVar2 = (ImFontConfig *)((long)pIVar2 + (ulong)bVar9 * -0x10 + 8);
  }
  lVar5 = (long)(this->ConfigData).Size;
  if (0 < lVar5) {
    pIVar2 = (this->ConfigData).Data;
    if (pIVar2[lVar5 + -1].DstFont == (ImFont *)0x0) {
      lVar3 = (long)(this->Fonts).Size;
      if (lVar3 < 1) {
        __function = "value_type &ImVector<ImFont *>::back() [T = ImFont *]";
        goto LAB_0014467e;
      }
      pIVar2[lVar5 + -1].DstFont = (this->Fonts).Data[lVar3 + -1];
    }
    if (pIVar2[lVar5 + -1].FontDataOwnedByAtlas == false) {
      __dest_00 = ImGui::MemAlloc((long)pIVar2[lVar5 + -1].FontDataSize);
      pIVar2[lVar5 + -1].FontData = __dest_00;
      pIVar2[lVar5 + -1].FontDataOwnedByAtlas = true;
      memcpy(__dest_00,font_cfg->FontData,(long)pIVar2[lVar5 + -1].FontDataSize);
    }
    ClearTexData(this);
    return pIVar2[lVar5 + -1].DstFont;
  }
  __function = "value_type &ImVector<ImFontConfig>::back() [T = ImFontConfig]";
LAB_0014467e:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                ,0x365,__function);
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
    {
        ImFont* font = (ImFont*)ImGui::MemAlloc(sizeof(ImFont));
        IM_PLACEMENT_NEW(font) ImFont();
        Fonts.push_back(font);
    }

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
	if (!new_font_cfg.DstFont)
	    new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = ImGui::MemAlloc(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}